

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O2

void __thiscall fileStoreFixture::~fileStoreFixture(fileStoreFixture *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  if (this->resetAfter == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"SETGET",&local_49);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"TEST",&local_4a);
    FIX::deleteSession(&local_28,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  FIX::FileStoreFactory::~FileStoreFactory(&this->factory);
  return;
}

Assistant:

~fileStoreFixture() {
    factory.destroy(object);

    if (resetAfter) {
      deleteSession("SETGET", "TEST");
    }
  }